

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

_Bool prefs_save(char *path,_func_void_ang_file_ptr *dump,char *title)

{
  ang_file *fff_00;
  ang_file *fff;
  char *title_local;
  _func_void_ang_file_ptr *dump_local;
  char *path_local;
  
  remove_old_dump(path,title);
  fff_00 = file_open(path,MODE_APPEND,FTYPE_TEXT);
  if (fff_00 != (ang_file *)0x0) {
    pref_header(fff_00,title);
    file_putf(fff_00,"\n");
    (*dump)(fff_00);
    file_putf(fff_00,"\n");
    pref_footer(fff_00,title);
    file_close(fff_00);
  }
  return fff_00 != (ang_file *)0x0;
}

Assistant:

bool prefs_save(const char *path, void (*dump)(ang_file *), const char *title)
{
	ang_file *fff;

	/* Remove old keymaps */
	remove_old_dump(path, title);

	fff = file_open(path, MODE_APPEND, FTYPE_TEXT);
	if (!fff) {
		return false;
	}

	/* Append the header */
	pref_header(fff, title);
	file_putf(fff, "\n");

	dump(fff);

	file_putf(fff, "\n");
	pref_footer(fff, title);
	file_close(fff);

	return true;
}